

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# torrent_peer.cpp
# Opt level: O0

uint32_t __thiscall
libtorrent::aux::torrent_peer::rank(torrent_peer *this,external_ip *external,int external_port)

{
  uint32_t uVar1;
  address local_b8;
  basic_endpoint<boost::asio::ip::tcp> local_94;
  address local_78;
  address local_58;
  basic_endpoint<boost::asio::ip::tcp> local_38;
  int local_1c;
  external_ip *peStack_18;
  int external_port_local;
  external_ip *external_local;
  torrent_peer *this_local;
  
  if (this->peer_rank == 0) {
    local_1c = external_port;
    peStack_18 = external;
    external_local = (external_ip *)this;
    address(&local_78,this);
    external_ip::external_address(&local_58,external,&local_78);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              (&local_38,&local_58,(unsigned_short)local_1c);
    address(&local_b8,this);
    boost::asio::ip::basic_endpoint<boost::asio::ip::tcp>::basic_endpoint
              (&local_94,&local_b8,this->port);
    uVar1 = peer_priority(&local_38,&local_94);
    this->peer_rank = uVar1;
  }
  return this->peer_rank;
}

Assistant:

std::uint32_t torrent_peer::rank(aux::external_ip const& external, int external_port) const
	{
		TORRENT_ASSERT(in_use);
		//TODO: how do we deal with our external address changing?
		if (peer_rank == 0)
			peer_rank = peer_priority(
				tcp::endpoint(external.external_address(this->address()), std::uint16_t(external_port))
				, tcp::endpoint(this->address(), this->port));
		return peer_rank;
	}